

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O2

void __thiscall
cbtAxisSweep3Internal<unsigned_short>::aabbTest
          (cbtAxisSweep3Internal<unsigned_short> *this,cbtVector3 *aabbMin,cbtVector3 *aabbMax,
          cbtBroadphaseAabbCallback *callback)

{
  ushort uVar1;
  cbtDbvtBroadphase *pcVar2;
  Handle *pHVar3;
  bool bVar4;
  unsigned_short i;
  ushort uVar5;
  
  pcVar2 = this->m_raycastAccelerator;
  if (pcVar2 != (cbtDbvtBroadphase *)0x0) {
    (*(pcVar2->super_cbtBroadphaseInterface)._vptr_cbtBroadphaseInterface[7])
              (pcVar2,aabbMin,aabbMax);
    return;
  }
  for (uVar5 = 1; (uint)uVar5 <= (uint)this->m_numHandles * 2; uVar5 = uVar5 + 1) {
    if ((this->m_pEdges[0][uVar5].m_pos & 1) != 0) {
      uVar1 = this->m_pEdges[0][uVar5].m_handle;
      pHVar3 = this->m_pHandles;
      bVar4 = TestAabbAgainstAabb2
                        (aabbMin,aabbMax,&pHVar3[uVar1].super_cbtBroadphaseProxy.m_aabbMin,
                         &pHVar3[uVar1].super_cbtBroadphaseProxy.m_aabbMax);
      if (bVar4) {
        (*callback->_vptr_cbtBroadphaseAabbCallback[2])(callback,pHVar3 + uVar1);
      }
    }
  }
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::aabbTest(const cbtVector3& aabbMin, const cbtVector3& aabbMax, cbtBroadphaseAabbCallback& callback)
{
	if (m_raycastAccelerator)
	{
		m_raycastAccelerator->aabbTest(aabbMin, aabbMax, callback);
	}
	else
	{
		//choose axis?
		BP_FP_INT_TYPE axis = 0;
		//for each proxy
		for (BP_FP_INT_TYPE i = 1; i < m_numHandles * 2 + 1; i++)
		{
			if (m_pEdges[axis][i].IsMax())
			{
				Handle* handle = getHandle(m_pEdges[axis][i].m_handle);
				if (TestAabbAgainstAabb2(aabbMin, aabbMax, handle->m_aabbMin, handle->m_aabbMax))
				{
					callback.process(handle);
				}
			}
		}
	}
}